

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  LongSooRep *pLVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  void *pvVar8;
  RepeatedField<unsigned_long> *pRVar9;
  int *piVar10;
  RepeatedField<unsigned_int> *pRVar11;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  ulong uVar12;
  string *psVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  long *plVar15;
  uint64_t *puVar16;
  uint64_t *puVar17;
  uint *puVar18;
  uint *puVar19;
  uint uVar20;
  Arena *pAVar21;
  bool bVar22;
  uint uVar23;
  bool bVar25;
  pair<const_char_*,_unsigned_int> pVar26;
  LogMessageFatal local_40 [16];
  uint uVar24;
  
  puVar18 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar18 & 3) != 0) {
    AlignFail(puVar18);
  }
  uVar24 = data.field_0._0_4_;
  uVar23 = uVar24 & 7;
  if (uVar23 == 2) {
    pcVar7 = MpPackedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  pvVar8 = MaybeGetSplitBase(msg,true,table);
  uVar20 = *(ushort *)((long)puVar18 + 10) & 0x1c0;
  if ((ulong)uVar20 == 0xc0) {
    if (uVar23 != 1) {
LAB_002a637a:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_002a6392;
    }
    plVar15 = (long *)((long)pvVar8 + (ulong)*puVar18);
    if (((ulong)plVar15 & 7) != 0) {
LAB_002a649f:
      AlignFail(plVar15);
    }
    if ((undefined1 *)*plVar15 == kZeroBuffer) {
      pAVar21 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar21 & 1) != 0) {
        pAVar21 = *(Arena **)((ulong)pAVar21 & 0xfffffffffffffffe);
      }
      pRVar9 = Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>(pAVar21)
      ;
      *plVar15 = (long)pRVar9;
    }
    pLVar3 = (LongSooRep *)*plVar15;
    puVar16 = (uint64_t *)ptr;
    do {
      aVar14.data = *puVar16;
      uVar12 = pLVar3->elements_int;
      bVar25 = (uVar12 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)pLVar3,bVar25);
      iVar6 = 1;
      if ((pLVar3->elements_int & 4) != 0) {
        iVar6 = pLVar3->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_long>::Grow
                  ((RepeatedField<unsigned_long> *)pLVar3,(uVar12 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar22 = bVar4 && bVar25;
      piVar10 = &pLVar3->size;
      if (!bVar4 || !bVar25) {
        piVar10 = (int *)LongSooRep::elements(pLVar3);
      }
      iVar6 = SooRep::size((SooRep *)pLVar3,bVar22);
      if ((iVar6 != iVar5 + 1) && ((pLVar3->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar3);
      }
      pcVar7 = (char *)(ulong)bVar22;
      RepeatedField<unsigned_long>::set_size
                ((RepeatedField<unsigned_long> *)pLVar3,bVar22,iVar5 + 1);
      ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(piVar10 + (long)iVar6 * 2))->data =
           (uint64_t)aVar14;
      ptr = (char *)(puVar16 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX;
        goto LAB_002a63a9;
      }
      bVar1 = (byte)puVar16[1];
      puVar17 = (uint64_t *)((long)puVar16 + 9);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar17;
        aVar14.data = (ulong)bVar2 << 7;
        uVar23 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar23;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar23;
          pVar26 = ReadTagFallback(ptr,uVar23);
          ctx_00 = pVar26._8_8_;
          puVar17 = (uint64_t *)pVar26.first;
        }
        else {
          puVar17 = (uint64_t *)((long)puVar16 + 10);
        }
      }
      if (puVar17 == (uint64_t *)0x0) {
        iVar6 = 5;
        goto LAB_002a63a9;
      }
      puVar16 = puVar17;
    } while ((uint)ctx_00 == uVar24);
    iVar6 = 0;
LAB_002a63a9:
    if (iVar6 != 0) {
      if (iVar6 != 4) goto LAB_002a6438;
      goto LAB_002a63ff;
    }
  }
  else {
    if (uVar20 == 0x80) {
      psVar13 = (string *)0x0;
    }
    else {
      psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          ((ulong)uVar20,0x80,
                           "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    }
    if (psVar13 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x6fb,*(undefined8 *)(psVar13 + 8),*(undefined8 *)psVar13);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
    }
    if (uVar23 != 5) goto LAB_002a637a;
    plVar15 = (long *)((long)pvVar8 + (ulong)*puVar18);
    if (((ulong)plVar15 & 7) != 0) goto LAB_002a649f;
    if ((undefined1 *)*plVar15 == kZeroBuffer) {
      pAVar21 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar21 & 1) != 0) {
        pAVar21 = *(Arena **)((ulong)pAVar21 & 0xfffffffffffffffe);
      }
      pRVar11 = Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_int>>(pAVar21)
      ;
      *plVar15 = (long)pRVar11;
    }
    pLVar3 = (LongSooRep *)*plVar15;
    puVar18 = (uint *)ptr;
    do {
      uVar23 = *puVar18;
      uVar12 = pLVar3->elements_int;
      bVar25 = (uVar12 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)pLVar3,bVar25);
      iVar6 = 2;
      if ((pLVar3->elements_int & 4) != 0) {
        iVar6 = pLVar3->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_int>::Grow
                  ((RepeatedField<unsigned_int> *)pLVar3,(uVar12 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar22 = bVar4 && bVar25;
      piVar10 = &pLVar3->size;
      if (!bVar4 || !bVar25) {
        piVar10 = (int *)LongSooRep::elements(pLVar3);
      }
      iVar6 = SooRep::size((SooRep *)pLVar3,bVar22);
      if ((iVar6 != iVar5 + 1) && ((pLVar3->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar3);
      }
      pcVar7 = (char *)(ulong)bVar22;
      RepeatedField<unsigned_int>::set_size((RepeatedField<unsigned_int> *)pLVar3,bVar22,iVar5 + 1);
      aVar14.data._4_4_ = 0;
      aVar14.data._0_4_ = uVar23;
      piVar10[iVar6] = uVar23;
      ptr = (char *)(puVar18 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX_00;
        goto LAB_002a63b9;
      }
      bVar1 = (byte)puVar18[1];
      puVar19 = (uint *)((long)puVar18 + 5);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar19;
        aVar14.data = (ulong)bVar2 << 7;
        uVar23 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar23;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar23;
          pVar26 = ReadTagFallback(ptr,uVar23);
          ctx_00 = pVar26._8_8_;
          puVar19 = (uint *)pVar26.first;
        }
        else {
          puVar19 = (uint *)((long)puVar18 + 6);
        }
      }
      if (puVar19 == (uint *)0x0) {
        iVar6 = 5;
        goto LAB_002a63b9;
      }
      puVar18 = puVar19;
    } while ((uint)ctx_00 == uVar24);
    iVar6 = 0;
LAB_002a63b9:
    if (iVar6 == 5) {
LAB_002a6438:
      pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)aVar14,table,hasbits);
      return pcVar7;
    }
    if (iVar6 == 4) goto LAB_002a63ff;
  }
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_002a63ff:
    if ((ulong)table->has_bits_offset != 0) {
      puVar18 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar18 & 3) != 0) {
        AlignFail();
      }
      *puVar18 = *puVar18 | (uint)hasbits;
    }
    return (char *)(uint64_t *)ptr;
  }
  uVar23 = (uint)table->fast_idx_mask & (uint)(ushort)*(uint64_t *)ptr;
  if ((uVar23 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar12 = (ulong)(uVar23 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)(ushort)*(uint64_t *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2)
                 );
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar12);
LAB_002a6392:
  pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}